

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

VdbeCursor * allocateCursor(Vdbe *p,int iCur,int nField,int iDb,int isBtreeCursor)

{
  int iVar1;
  Mem *pMem_00;
  int local_3c;
  VdbeCursor *local_38;
  VdbeCursor *pCx;
  int nByte;
  Mem *pMem;
  int isBtreeCursor_local;
  int iDb_local;
  int nField_local;
  int iCur_local;
  Vdbe *p_local;
  
  pMem_00 = p->aMem + (p->nMem - iCur);
  local_38 = (VdbeCursor *)0x0;
  if (isBtreeCursor == 0) {
    local_3c = 0;
  }
  else {
    local_3c = sqlite3BtreeCursorSize();
  }
  if (p->apCsr[iCur] != (VdbeCursor *)0x0) {
    sqlite3VdbeFreeCursor(p,p->apCsr[iCur]);
    p->apCsr[iCur] = (VdbeCursor *)0x0;
  }
  iVar1 = sqlite3VdbeMemGrow(pMem_00,local_3c + 0x88 + nField * 8,0);
  if (iVar1 == 0) {
    local_38 = (VdbeCursor *)pMem_00->z;
    p->apCsr[iCur] = local_38;
    memset(local_38,0,0x88);
    local_38->iDb = iDb;
    local_38->nField = nField;
    if (nField != 0) {
      local_38->aType = (u32 *)(pMem_00->z + 0x88);
    }
    if (isBtreeCursor != 0) {
      local_38->pCursor = (BtCursor *)(pMem_00->z + (long)(nField << 1) * 4 + 0x88);
      sqlite3BtreeCursorZero(local_38->pCursor);
    }
  }
  return local_38;
}

Assistant:

static VdbeCursor *allocateCursor(
  Vdbe *p,              /* The virtual machine */
  int iCur,             /* Index of the new VdbeCursor */
  int nField,           /* Number of fields in the table or index */
  int iDb,              /* Database the cursor belongs to, or -1 */
  int isBtreeCursor     /* True for B-Tree.  False for pseudo-table or vtab */
){
  /* Find the memory cell that will be used to store the blob of memory
  ** required for this VdbeCursor structure. It is convenient to use a 
  ** vdbe memory cell to manage the memory allocation required for a
  ** VdbeCursor structure for the following reasons:
  **
  **   * Sometimes cursor numbers are used for a couple of different
  **     purposes in a vdbe program. The different uses might require
  **     different sized allocations. Memory cells provide growable
  **     allocations.
  **
  **   * When using ENABLE_MEMORY_MANAGEMENT, memory cell buffers can
  **     be freed lazily via the sqlite3_release_memory() API. This
  **     minimizes the number of malloc calls made by the system.
  **
  ** Memory cells for cursors are allocated at the top of the address
  ** space. Memory cell (p->nMem) corresponds to cursor 0. Space for
  ** cursor 1 is managed by memory cell (p->nMem-1), etc.
  */
  Mem *pMem = &p->aMem[p->nMem-iCur];

  int nByte;
  VdbeCursor *pCx = 0;
  nByte = 
      ROUND8(sizeof(VdbeCursor)) + 
      (isBtreeCursor?sqlite3BtreeCursorSize():0) + 
      2*nField*sizeof(u32);

  assert( iCur<p->nCursor );
  if( p->apCsr[iCur] ){
    sqlite3VdbeFreeCursor(p, p->apCsr[iCur]);
    p->apCsr[iCur] = 0;
  }
  if( SQLITE_OK==sqlite3VdbeMemGrow(pMem, nByte, 0) ){
    p->apCsr[iCur] = pCx = (VdbeCursor*)pMem->z;
    memset(pCx, 0, sizeof(VdbeCursor));
    pCx->iDb = iDb;
    pCx->nField = nField;
    if( nField ){
      pCx->aType = (u32 *)&pMem->z[ROUND8(sizeof(VdbeCursor))];
    }
    if( isBtreeCursor ){
      pCx->pCursor = (BtCursor*)
          &pMem->z[ROUND8(sizeof(VdbeCursor))+2*nField*sizeof(u32)];
      sqlite3BtreeCursorZero(pCx->pCursor);
    }
  }
  return pCx;
}